

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_gather_multiple(bsc_step_t depends,bsc_pid_t root,bsc_group_t group,bsc_coll_params_t *set,
                   bsc_size_t n)

{
  int local_28;
  bsc_size_t i;
  bsc_size_t n_local;
  bsc_coll_params_t *set_local;
  bsc_group_t group_local;
  bsc_pid_t root_local;
  bsc_step_t depends_local;
  
  for (local_28 = 0; local_28 < n; local_28 = local_28 + 1) {
    bsc_gather_single(depends,root,group,set[local_28].src,set[local_28].dst,set[local_28].size);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_gather_multiple( bsc_step_t depends,
                        bsc_pid_t root, bsc_group_t group,
                        bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    for ( i = 0; i < n ; ++i )
        bsc_gather_single( depends, root, group, 
                set[i].src, set[i].dst, set[i].size );
    return depends + 1;
}